

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_object_class_test.cpp
# Opt level: O3

int hello_world_object_impl_interface_set
              (object obj,object_impl impl,accessor_type *accessor,value v)

{
  undefined1 uVar1;
  char *pcVar2;
  undefined8 uVar3;
  char *message;
  AssertHelper local_40;
  Message local_38;
  internal local_30 [8];
  undefined8 *local_28;
  
  pcVar2 = (char *)attribute_name((accessor->data).key);
  local_38.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (unique_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )0x0;
  local_40.data_ = (AssertHelperData *)impl;
  testing::internal::CmpHelperNE<void*,void*>
            (local_30,"(void *)__null","(void *)hello_world",(void **)&local_38,&local_40.data_);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message(&local_38);
    if (local_28 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (char *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/reflect_object_class_test/source/reflect_object_class_test.cpp"
               ,0x58,message);
    testing::internal::AssertHelper::operator=(&local_40,&local_38);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_38.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_38.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(local_28);
  }
  if (*pcVar2 == 'e') {
    if (pcVar2[1] == '\0') {
      uVar3 = value_to_long(v);
      *(undefined8 *)((long)impl + 8) = uVar3;
    }
  }
  else if ((*pcVar2 == 'd') && (pcVar2[1] == '\0')) {
    uVar1 = value_to_char(v);
    *(undefined1 *)impl = uVar1;
  }
  return 0;
}

Assistant:

int hello_world_object_impl_interface_set(object obj, object_impl impl, struct accessor_type *accessor, value v)
{
	hello_world_object hello_world = (hello_world_object)impl;
	attribute attr = accessor->data.attr;
	const char *key = attribute_name(attr);

	EXPECT_NE((void *)NULL, (void *)hello_world);

	(void)obj;

	// Horrible but it is just a ilustrative example
	if (strcmp(key, "d") == 0)
	{
		hello_world->d = value_to_char(v);
	}
	else if (strcmp(key, "e") == 0)
	{
		hello_world->e = value_to_long(v);
	}

	return 0;
}